

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,Type type)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  uint *puVar1;
  int iVar2;
  SPxOut *pSVar3;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Verbosity old_verbosity;
  cpp_dec_float<50U,_int,_void> local_108;
  shared_ptr<soplex::Tolerances> local_c8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  pSVar9 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  this_00 = &pSVar9->weights;
  this_01 = &pSVar9->coWeights;
  if (this->setup == DEFAULT) {
    if (type == ENTER) {
      if (pSVar9->weightsAreSetup == false) {
        iVar8 = (pSVar9->thecovectors->set).thenum;
        iVar10 = 0;
        iVar11 = 0;
      }
      else {
        iVar11 = (int)((ulong)((long)(pSVar9->coWeights).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pSVar9->coWeights).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar10 = iVar11 * -0x49249249;
        iVar8 = (pSVar9->thecovectors->set).thenum;
        if (SBORROW4(iVar8,iVar10) != iVar8 + iVar11 * 0x49249249 < 0) {
          iVar10 = iVar8;
        }
        iVar14 = (int)((ulong)((long)(pSVar9->weights).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pSVar9->weights).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar11 = iVar14 * -0x49249249;
        iVar2 = (pSVar9->thevectors->set).thenum;
        if (SBORROW4(iVar2,iVar11) != iVar2 + iVar14 * 0x49249249 < 0) {
          iVar11 = iVar2;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::resize(&this_01->val,(long)iVar8);
      pSVar9 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar8 = (pSVar9->thecovectors->set).thenum;
      lVar16 = (long)iVar8;
      if (iVar10 < iVar8) {
        lVar13 = lVar16 * 0x38;
        do {
          lVar16 = lVar16 + -1;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)
                     ((long)(this_01->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar13),2.0);
          lVar13 = lVar13 + -0x38;
        } while (iVar10 < lVar16);
        pSVar9 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::resize(&this_00->val,(long)(pSVar9->thevectors->set).thenum);
      iVar8 = (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->thevectors->set).thenum;
      lVar16 = (long)iVar8;
      if (iVar11 < iVar8) {
        lVar13 = lVar16 * 0x38;
        do {
          lVar16 = lVar16 + -1;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)
                     ((long)(this_00->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar13),1.0);
          lVar13 = lVar13 + -0x38;
        } while (iVar11 < lVar16);
      }
    }
    else {
      if (pSVar9->weightsAreSetup == false) {
        iVar8 = (pSVar9->thecovectors->set).thenum;
        iVar10 = 0;
      }
      else {
        iVar11 = (int)((ulong)((long)(pSVar9->coWeights).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pSVar9->coWeights).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar10 = iVar11 * -0x49249249;
        iVar8 = (pSVar9->thecovectors->set).thenum;
        if (SBORROW4(iVar8,iVar10) != iVar8 + iVar11 * 0x49249249 < 0) {
          iVar10 = iVar8;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::resize(&this_01->val,(long)iVar8);
      iVar8 = (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->thecovectors->set).thenum;
      lVar16 = (long)iVar8;
      if (iVar10 < iVar8) {
        lVar13 = lVar16 * 0x38;
        do {
          lVar16 = lVar16 + -1;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)
                     ((long)(this_01->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar13),1.0);
          lVar13 = lVar13 + -0x38;
        } while (iVar10 < lVar16);
      }
    }
  }
  else {
    pSVar3 = pSVar9->spxout;
    if ((pSVar3 != (SPxOut *)0x0) && (2 < (int)pSVar3->m_verbosity)) {
      local_b8.super_IdxSet._vptr_IdxSet =
           (_func_int **)CONCAT44(local_b8.super_IdxSet._vptr_IdxSet._4_4_,pSVar3->m_verbosity);
      local_108.data._M_elems[0] = 3;
      (*pSVar3->_vptr_SPxOut[2])();
      pSVar3 = ((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity],
                 " --- initializing steepest edge multipliers",0x2b);
      cVar6 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pSVar3 = ((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->spxout;
      (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_b8);
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::resize(&this_01->val,
             (long)(((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->thecovectors->set).thenum);
    if (type == ENTER) {
      pSVar9 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      lVar16 = (long)(pSVar9->thecovectors->set).thenum;
      if (0 < lVar16) {
        uVar15 = lVar16 + 1;
        lVar16 = lVar16 * 0x38;
        do {
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)
                     ((long)(this_01->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar16),1.0);
          uVar15 = uVar15 - 1;
          lVar16 = lVar16 + -0x38;
        } while (1 < uVar15);
        pSVar9 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::resize(&this_00->val,(long)(pSVar9->thevectors->set).thenum);
      uVar15 = (ulong)(((this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->thevectors->set).thenum;
      if (0 < (long)uVar15) {
        uVar12 = uVar15 + 1;
        lVar16 = ~uVar15 + uVar15 * 8;
        do {
          pSVar4 = ((this->
                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->thevectors;
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length2(&local_68,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((pSVar4->set).theitem + (pSVar4->set).thekey[uVar12 - 2].idx));
          local_108.fpclass = cpp_dec_float_finite;
          local_108.prec_elem = 10;
          local_108.data._M_elems[0] = 0;
          local_108.data._M_elems[1] = 0;
          local_108.data._M_elems[2] = 0;
          local_108.data._M_elems[3] = 0;
          local_108.data._M_elems[4] = 0;
          local_108.data._M_elems[5] = 0;
          local_108.data._M_elems._24_5_ = 0;
          local_108.data._M_elems[7]._1_3_ = 0;
          local_108.data._M_elems._32_5_ = 0;
          local_108.data._M_elems[9]._1_3_ = 0;
          local_108.exp = 0;
          local_108.neg = false;
          local_b8.
          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xa00000000;
          local_b8.super_IdxSet._vptr_IdxSet = (_func_int **)0x0;
          local_b8.super_IdxSet.num = 0;
          local_b8.super_IdxSet.len = 0;
          local_b8.super_IdxSet.idx = (int *)0x0;
          local_b8.super_IdxSet.freeArray = false;
          local_b8.super_IdxSet._25_4_ = 0;
          local_b8.super_IdxSet._29_3_ = 0;
          local_b8.
          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_5_ = 0;
          local_b8.
          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._5_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_b8,1.0);
          local_108.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
          local_108.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
          local_108.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
          local_108.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
          local_108.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
          local_108.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
          local_108.data._M_elems._24_5_ = local_68.m_backend.data._M_elems._24_5_;
          local_108.data._M_elems[7]._1_3_ = local_68.m_backend.data._M_elems[7]._1_3_;
          local_108.data._M_elems._32_5_ = local_68.m_backend.data._M_elems._32_5_;
          local_108.data._M_elems[9]._1_3_ = local_68.m_backend.data._M_elems[9]._1_3_;
          local_108.exp = local_68.m_backend.exp;
          local_108.neg = local_68.m_backend.neg;
          local_108.fpclass = local_68.m_backend.fpclass;
          local_108.prec_elem = local_68.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_108,(cpp_dec_float<50U,_int,_void> *)&local_b8);
          pnVar5 = (this_00->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((pnVar5->m_backend).data._M_elems + lVar16 * 2 + -4) =
               CONCAT35(local_108.data._M_elems[9]._1_3_,local_108.data._M_elems._32_5_);
          puVar1 = (pnVar5->m_backend).data._M_elems + lVar16 * 2 + -8;
          *(undefined8 *)puVar1 = local_108.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
          puVar1 = (pnVar5->m_backend).data._M_elems + lVar16 * 2 + -0xc;
          *(undefined8 *)puVar1 = local_108.data._M_elems._0_8_;
          *(undefined8 *)(puVar1 + 2) = local_108.data._M_elems._8_8_;
          (pnVar5->m_backend).data._M_elems[lVar16 * 2 + -2] = local_108.exp;
          *(bool *)((pnVar5->m_backend).data._M_elems + lVar16 * 2 + -1) = local_108.neg;
          puVar1 = (pnVar5->m_backend).data._M_elems + lVar16 * 2;
          puVar1[0] = local_108.fpclass;
          puVar1[1] = local_108.prec_elem;
          uVar12 = uVar12 - 1;
          lVar16 = lVar16 + -7;
        } while (1 < uVar12);
      }
    }
    else {
      pSVar9 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar8 = (pSVar9->thecovectors->set).thenum;
      local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pSVar9->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (pSVar9->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::SSVectorBase(&local_b8,iVar8,&local_c8);
      if (local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      lVar16 = (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thecovectors->set).thenum;
      if (0 < lVar16) {
        uVar15 = lVar16 + 1;
        lVar13 = lVar16 * 0x38 + -8;
        lVar16 = lVar16 * 0x50;
        do {
          bVar7 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isTimeLimitReached
                            ((this->
                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).thesolver,false);
          if (bVar7) break;
          pSVar9 = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(&pSVar9->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,&local_b8,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)(pSVar9->unitVecs).data.
                              super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].themem.val.m_backend.
                              data._M_elems + lVar16 + -0x10));
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::length2((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_108,&local_b8);
          pnVar5 = (this_01->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((long)(pnVar5->m_backend).data._M_elems + lVar13 + -0x10) =
               CONCAT35(local_108.data._M_elems[9]._1_3_,local_108.data._M_elems._32_5_);
          puVar1 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar13 + -0x20);
          *(undefined8 *)puVar1 = local_108.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
          puVar1 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar13 + -0x30);
          *(undefined8 *)puVar1 = local_108.data._M_elems._0_8_;
          *(undefined8 *)(puVar1 + 2) = local_108.data._M_elems._8_8_;
          *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar13 + -8) = local_108.exp;
          *(bool *)((long)(pnVar5->m_backend).data._M_elems + lVar13 + -4) = local_108.neg;
          *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar13) = local_108._48_8_;
          uVar15 = uVar15 - 1;
          lVar13 = lVar13 + -0x38;
          lVar16 = lVar16 + -0x50;
        } while (1 < uVar15);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~SSVectorBase(&local_b8);
    }
  }
  ((this->
   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thesolver)->weightsAreSetup = true;
  return;
}

Assistant:

void SPxSteepPR<R>::setupWeights(typename SPxSolverBase<R>::Type type)
{
   int i;
   int endDim = 0;
   int endCoDim = 0;
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(setup == DEFAULT)
   {
      if(type == SPxSolverBase<R>::ENTER)
      {
         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();

            if(weights.dim() < this->thesolver->coDim())
               endCoDim = weights.dim();
            else
               endCoDim = this->thesolver->coDim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 2.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0;
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);

         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i]   = 1.0;
      }
   }
   else
   {
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- initializing steepest edge multipliers" << std::endl;)

      if(type == SPxSolverBase<R>::ENTER)
      {
         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 1.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0 + this->thesolver->vector(i).length2();
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);
         coWeights.reDim(this->thesolver->dim(), false);
         SSVectorBase<R>  tmp(this->thesolver->dim(), this->thesolver->tolerances());

         for(i = this->thesolver->dim() - 1; i >= endDim && !this->thesolver->isTimeLimitReached(); --i)
         {
            this->thesolver->basis().coSolve(tmp, this->thesolver->unitVector(i));
            coWeights[i] = tmp.length2();
         }
      }
   }

   this->thesolver->weightsAreSetup = true;
}